

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

void print_mem_segment_info(mem_segment sec)

{
  uint32 *puVar1;
  ulong uVar2;
  
  if (sec.mem_segment_count != 0) {
    puVar1 = &(sec.mem_segment_addr)->max;
    uVar2 = 0;
    do {
      printf("  - memory[%d]: pages ",uVar2 & 0xffffffff);
      printf("min=%d",(ulong)puVar1[-1]);
      if (((limit *)(puVar1 + -2))->tag == '\x01') {
        printf(" max=%d",(ulong)*puVar1);
      }
      putchar(10);
      uVar2 = uVar2 + 1;
      puVar1 = puVar1 + 3;
    } while ((sec._0_8_ & 0xffffffff) != uVar2);
  }
  return;
}

Assistant:

void print_mem_segment_info(mem_segment sec) {
    mem_pointer mem_segment_addr;
    for (int i = 0; i < sec.mem_segment_count; ++i) {
        mem_segment_addr = sec.mem_segment_addr + i;
        printf("  - memory[%d]: pages ", i);
        printf("min=%d", mem_segment_addr->min);
        if (mem_segment_addr->tag == min_and_max)
            printf(" max=%d", mem_segment_addr->max);
        puts("");
    }
}